

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::HasLineBreak(FunctionBody *this,charcount_t start,charcount_t end)

{
  char16 cVar1;
  uint uVar2;
  LPCUTF8 puVar3;
  ulong local_60;
  uint local_48;
  DecodeOptions local_44;
  charcount_t cch;
  DecodeOptions options;
  size_t offset;
  LPCUTF8 last;
  LPCUTF8 src;
  charcount_t local_20;
  charcount_t cchLength;
  charcount_t end_local;
  charcount_t start_local;
  FunctionBody *this_local;
  
  if (((start <= end) &&
      (src._4_4_ = end - start, (this->super_ParseableFunctionInfo).m_cchStartOffset <= start)) &&
     (src._4_4_ <= (this->super_ParseableFunctionInfo).m_cchLength)) {
    local_20 = end;
    cchLength = start;
    _end_local = this;
    puVar3 = ParseableFunctionInfo::GetSource
                       (&this->super_ParseableFunctionInfo,L"FunctionBody::HasLineBreak");
    last = puVar3;
    uVar2 = ParseableFunctionInfo::LengthInBytes(&this->super_ParseableFunctionInfo);
    offset = (size_t)(puVar3 + uVar2);
    uVar2 = ParseableFunctionInfo::LengthInBytes(&this->super_ParseableFunctionInfo);
    puVar3 = last;
    if (uVar2 == (this->super_ParseableFunctionInfo).m_cchLength) {
      local_60 = (ulong)(cchLength - (this->super_ParseableFunctionInfo).m_cchStartOffset);
    }
    else {
      uVar2 = ParseableFunctionInfo::LengthInBytes(&this->super_ParseableFunctionInfo);
      local_60 = utf8::CharacterIndexToByteIndex
                           (puVar3,(ulong)uVar2,
                            cchLength - (this->super_ParseableFunctionInfo).m_cchStartOffset,
                            doAllowThreeByteSurrogates);
    }
    _cch = local_60;
    last = last + local_60;
    local_44 = doAllowThreeByteSurrogates;
    for (local_48 = src._4_4_; local_48 != 0; local_48 = local_48 - 1) {
      cVar1 = utf8::Decode(&last,(LPCUTF8)offset,&local_44,(bool *)0x0);
      if (((cVar1 == L'\n') || (cVar1 == L'\r')) || (cVar1 == L'\x2028' || cVar1 == L'\x2029')) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool FunctionBody::HasLineBreak(charcount_t start, charcount_t end) const
    {
        if (start > end) return false;
        charcount_t cchLength = end - start;
        if (start < this->m_cchStartOffset || cchLength > this->m_cchLength) return false;
        LPCUTF8 src = this->GetSource(_u("FunctionBody::HasLineBreak"));
        LPCUTF8 last = src + this->LengthInBytes();
        size_t offset = this->LengthInBytes() == this->m_cchLength ?
            start - this->m_cchStartOffset :
            utf8::CharacterIndexToByteIndex(src, this->LengthInBytes(), start - this->m_cchStartOffset, utf8::doAllowThreeByteSurrogates);
        src = src + offset;

        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        for (charcount_t cch = cchLength; cch > 0; --cch)
        {
            switch (utf8::Decode(src, last, options))
            {
            case '\r':
            case '\n':
            case 0x2028:
            case 0x2029:
                return true;
            }
        }

        return false;
    }